

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

DBaseStatusBar * CreateCustomStatusBar(int script)

{
  DSBarInfo *this;
  size_t in_RSI;
  int script_local;
  
  if (SBarInfoScript[script] == (SBarInfo *)0x0) {
    I_FatalError("Tried to create a status bar with no script!");
  }
  this = (DSBarInfo *)DObject::operator_new((DObject *)0xe8,in_RSI);
  DSBarInfo::DSBarInfo(this,SBarInfoScript[script]);
  return &this->super_DBaseStatusBar;
}

Assistant:

DBaseStatusBar *CreateCustomStatusBar (int script)
{
	if(SBarInfoScript[script] == NULL)
		I_FatalError("Tried to create a status bar with no script!");
	return new DSBarInfo(SBarInfoScript[script]);
}